

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O1

void __thiscall cfd::CoinSelectionOption::InitializeTxSizeInfo(CoinSelectionOption *this)

{
  bool *pbVar1;
  uint32_t uVar2;
  TxOut txout;
  TxOutReference txout_ref;
  Script wpkh_script;
  TxOut local_120;
  AbstractTxOutReference local_d0;
  Script local_80;
  Script local_48;
  
  pbVar1 = &local_120.super_AbstractTxOut.value_.ignore_check_;
  local_120.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)pbVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,"0014ffffffffffffffffffffffffffffffffffffffff","");
  core::Script::Script(&local_48,(string *)&local_120);
  if (local_120.super_AbstractTxOut._vptr_AbstractTxOut != (_func_int **)pbVar1) {
    operator_delete(local_120.super_AbstractTxOut._vptr_AbstractTxOut);
  }
  core::Amount::Amount((Amount *)&local_d0);
  core::TxOut::TxOut(&local_120,(Amount *)&local_d0,&local_48);
  core::TxOutReference::TxOutReference((TxOutReference *)&local_d0,&local_120);
  uVar2 = core::AbstractTxOutReference::GetSerializeVsize(&local_d0);
  this->change_output_size_ = uVar2;
  core::Script::Script(&local_80);
  uVar2 = core::TxIn::EstimateTxInVsize(kP2wpkhAddress,&local_80,(Script *)0x0);
  this->change_spend_size_ = uVar2;
  core::Script::~Script(&local_80);
  local_d0._vptr_AbstractTxOutReference = (_func_int **)&PTR__AbstractTxOutReference_007356f0;
  core::Script::~Script(&local_d0.locking_script_);
  local_120.super_AbstractTxOut._vptr_AbstractTxOut = (_func_int **)&PTR__AbstractTxOut_007407d8;
  core::Script::~Script(&local_120.super_AbstractTxOut.locking_script_);
  core::Script::~Script(&local_48);
  return;
}

Assistant:

void CoinSelectionOption::InitializeTxSizeInfo() {
  // wpkh想定
  Script wpkh_script("0014ffffffffffffffffffffffffffffffffffffffff");
  TxOut txout(Amount(), wpkh_script);
  TxOutReference txout_ref(txout);
  change_output_size_ = txout_ref.GetSerializeVsize();
  change_spend_size_ =
      TxIn::EstimateTxInVsize(AddressType::kP2wpkhAddress, Script());
}